

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O3

void Abc_SclInsertBarBufs(Abc_Ntk_t *pNtk,Vec_Int_t *vBufs)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = vBufs->nSize;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      iVar1 = vBufs->pArray[lVar4];
      if (((long)iVar1 < 0) || (pNtk->vObjs->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pNtk->vObjs->pArray[iVar1];
      if (pvVar2 != (void *)0x0) {
        *(undefined8 *)((long)pvVar2 + 0x38) = 0;
        iVar3 = vBufs->nSize;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  return;
}

Assistant:

void Abc_SclInsertBarBufs( Abc_Ntk_t * pNtk, Vec_Int_t * vBufs )
{
    Abc_Obj_t * pObj; int i;
    Abc_NtkForEachObjVec( vBufs, pNtk, pObj, i )
        pObj->pData = NULL;
}